

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O3

HighsDebugStatus __thiscall HEkk::debugRetainedDataOk(HEkk *this,HighsLp *lp)

{
  HighsOptions *pHVar1;
  HighsDebugStatus HVar2;
  HighsStatus HVar3;
  HighsDebugStatus debug_status;
  string local_48;
  
  HVar2 = kNotChecked;
  if (((this->status_).initialised_for_new_lp == true) &&
     (pHVar1 = this->options_, 1 < (pHVar1->super_HighsOptionsStruct).highs_debug_level)) {
    HVar2 = kOk;
    if ((this->status_).has_basis == true) {
      HVar2 = debugBasisCorrect(this,lp);
      HVar3 = debugDebugToHighsStatus(HVar2);
      HVar2 = kOk;
      if (HVar3 == kError) {
        highsLogDev(&(pHVar1->super_HighsOptionsStruct).log_options,kError,
                    "Supposed to be a Simplex basis, but incorrect\n");
        HVar2 = kLogicalError;
      }
    }
    if ((this->status_).has_invert == true) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"HEkk::debugRetainedDataOk","");
      debug_status = debugNlaCheckInvert(this,&local_48,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      HVar3 = debugDebugToHighsStatus(debug_status);
      if (HVar3 == kError) {
        highsLogDev(&(pHVar1->super_HighsOptionsStruct).log_options,kError,
                    "Supposed to be a simplex basis inverse, but too inaccurate\n");
        HVar2 = kLogicalError;
      }
    }
  }
  return HVar2;
}

Assistant:

HighsDebugStatus HEkk::debugRetainedDataOk(const HighsLp& lp) const {
  if (!this->status_.initialised_for_new_lp ||
      this->options_->highs_debug_level < kHighsDebugLevelCostly)
    return HighsDebugStatus::kNotChecked;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;

  const HighsOptions& options = *(this->options_);
  if (this->status_.has_basis) {
    HighsDebugStatus call_status = this->debugBasisCorrect(&lp);
    const bool basis_correct =
        debugDebugToHighsStatus(call_status) != HighsStatus::kError;
    if (!basis_correct) {
      highsLogDev(options.log_options, HighsLogType::kError,
                  "Supposed to be a Simplex basis, but incorrect\n");
      assert(basis_correct);
      return_status = HighsDebugStatus::kLogicalError;
    }
  }

  if (this->status_.has_invert) {
    HighsDebugStatus call_status =
        this->debugNlaCheckInvert("HEkk::debugRetainedDataOk");
    const bool invert_ok =
        debugDebugToHighsStatus(call_status) != HighsStatus::kError;
    if (!invert_ok) {
      highsLogDev(
          options.log_options, HighsLogType::kError,
          "Supposed to be a simplex basis inverse, but too inaccurate\n");
      assert(invert_ok);
      return_status = HighsDebugStatus::kLogicalError;
    }
  }
  return return_status;
}